

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

LPColSetBase<double> * __thiscall
soplex::LPColSetBase<double>::operator=(LPColSetBase<double> *this,LPColSetBase<double> *rs)

{
  LPColSetBase<double> *in_RSI;
  LPColSetBase<double> *in_RDI;
  DataArray<int> *unaff_retaddr;
  SVSetBase<double> *in_stack_00000038;
  SVSetBase<double> *in_stack_00000040;
  LPColSetBase<double> *rhs;
  
  if (in_RDI != in_RSI) {
    rhs = in_RDI;
    SVSetBase<double>::operator=(in_stack_00000040,in_stack_00000038);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    VectorBase<double>::operator=((VectorBase<double> *)in_RSI,(VectorBase<double> *)in_RDI);
    DataArray<int>::operator=(unaff_retaddr,(DataArray<int> *)rhs);
  }
  return in_RDI;
}

Assistant:

LPColSetBase<R>& operator=(const LPColSetBase<R>& rs)
   {
      if(this != &rs)
      {
         SVSetBase<R>::operator=(rs);
         low = rs.low;
         up = rs.up;
         object = rs.object;
         scaleExp = rs.scaleExp;

         assert(isConsistent());
      }

      return *this;
   }